

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O1

bool __thiscall
re2::Regexp::ParseState::PushRepetition
          (ParseState *this,int min,int max,StringPiece *s,bool nongreedy)

{
  ParseFlags parse_flags;
  size_type sVar1;
  bool bVar2;
  int iVar3;
  RegexpStatus *pRVar4;
  ParseState *this_00;
  Regexp *pRVar5;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar6;
  ParseState *this_01;
  RepetitionWalker w;
  Walker<int> local_90;
  
  if ((max == -1 || min <= max) && (min <= maximum_repeat_count && max <= maximum_repeat_count)) {
    if ((this->stacktop_ != (Regexp *)0x0) && (this->stacktop_->op_ < 0x16)) {
      parse_flags = this->flags_ ^ NonGreedy;
      if (!nongreedy) {
        parse_flags = this->flags_;
      }
      this_00 = (ParseState *)operator_new(0x28);
      this_01 = this_00;
      Regexp((Regexp *)this_00,kRegexpRepeat,parse_flags);
      (((anon_union_16_7_2f55f9ff_for_Regexp_10 *)&this_00->status_)->field_0).min_ = min;
      (((anon_union_16_7_2f55f9ff_for_Regexp_10 *)&this_00->status_)->field_0).max_ = max;
      *(uint16_t *)&this_00->field_0x6 = 1;
      pRVar5 = this->stacktop_;
      ((anon_union_8_2_3df47e5c_for_Regexp_7 *)&this_00->whole_regexp_)[1] =
           (anon_union_8_2_3df47e5c_for_Regexp_7)pRVar5->down_;
      pRVar5 = FinishRegexp(this_01,pRVar5);
      if (*(ushort *)&this_00->field_0x6 < 2) {
        paVar6 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)&this_00->whole_regexp_;
      }
      else {
        paVar6 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)
                 ((anon_union_8_2_3df47e5c_for_Regexp_7 *)&this_00->whole_regexp_)->submany_;
      }
      paVar6->subone_ = pRVar5;
      bVar2 = ComputeSimple((Regexp *)this_00);
      *(bool *)((long)&this_00->flags_ + 1) = bVar2;
      this->stacktop_ = (Regexp *)this_00;
      if (1 < min || 1 < max) {
        local_90._vptr_Walker = (_func_int **)&PTR__Walker_002d8cf0;
        local_90.stack_.c.
        super__Deque_base<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>._M_impl.
        super__Deque_impl_data._M_map = (_Map_pointer)0x0;
        local_90.stack_.c.
        super__Deque_base<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>._M_impl.
        super__Deque_impl_data._M_map_size = 0;
        local_90.stack_.c.
        super__Deque_base<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>._M_impl.
        super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
        local_90.stack_.c.
        super__Deque_base<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>._M_impl.
        super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
        local_90.stack_.c.
        super__Deque_base<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>._M_impl.
        super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
        local_90.stack_.c.
        super__Deque_base<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>._M_impl.
        super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
        local_90.stack_.c.
        super__Deque_base<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
        local_90.stack_.c.
        super__Deque_base<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
        local_90.stack_.c.
        super__Deque_base<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>._M_impl.
        super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
        local_90.stack_.c.
        super__Deque_base<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>._M_impl.
        super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
        std::_Deque_base<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>::
        _M_initialize_map((_Deque_base<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_> *
                          )&local_90.stack_,0);
        local_90.stopped_early_ = false;
        local_90._vptr_Walker = (_func_int **)&PTR__Walker_002d8f10;
        local_90.max_visits_ = 1000000;
        iVar3 = Walker<int>::WalkInternal(&local_90,this->stacktop_,maximum_repeat_count,true);
        if (iVar3 == 0) {
          pRVar4 = this->status_;
          pRVar4->code_ = kRegexpRepeatSize;
          sVar1 = s->size_;
          (pRVar4->error_arg_).data_ = s->data_;
          (pRVar4->error_arg_).size_ = sVar1;
          Walker<int>::~Walker(&local_90);
          return false;
        }
        Walker<int>::~Walker(&local_90);
        return true;
      }
      return true;
    }
    pRVar4 = this->status_;
    pRVar4->code_ = kRegexpRepeatArgument;
  }
  else {
    pRVar4 = this->status_;
    pRVar4->code_ = kRegexpRepeatSize;
  }
  sVar1 = s->size_;
  (pRVar4->error_arg_).data_ = s->data_;
  (pRVar4->error_arg_).size_ = sVar1;
  return false;
}

Assistant:

bool Regexp::ParseState::PushRepetition(int min, int max,
                                        const StringPiece& s,
                                        bool nongreedy) {
  if ((max != -1 && max < min) ||
      min > maximum_repeat_count ||
      max > maximum_repeat_count) {
    status_->set_code(kRegexpRepeatSize);
    status_->set_error_arg(s);
    return false;
  }
  if (stacktop_ == NULL || IsMarker(stacktop_->op())) {
    status_->set_code(kRegexpRepeatArgument);
    status_->set_error_arg(s);
    return false;
  }
  Regexp::ParseFlags fl = flags_;
  if (nongreedy)
    fl = fl ^ NonGreedy;
  Regexp* re = new Regexp(kRegexpRepeat, fl);
  re->min_ = min;
  re->max_ = max;
  re->AllocSub(1);
  re->down_ = stacktop_->down_;
  re->sub()[0] = FinishRegexp(stacktop_);
  re->simple_ = re->ComputeSimple();
  stacktop_ = re;
  if (min >= 2 || max >= 2) {
    RepetitionWalker w;
    if (w.Walk(stacktop_, maximum_repeat_count) == 0) {
      status_->set_code(kRegexpRepeatSize);
      status_->set_error_arg(s);
      return false;
    }
  }
  return true;
}